

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Unicode.cc
# Opt level: O2

void onmt::unicode::explode_utf8_with_marks
               (string *str,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *chars,vector<int,_std::allocator<int>_> *code_points_main,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *code_points_combining,vector<int,_std::allocator<int>_> *protected_chars)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  bool bVar2;
  code_point_t u;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var3;
  size_t sVar4;
  pointer str_00;
  code_point_t local_5c;
  size_t local_58;
  vector<int,_std::allocator<int>_> *local_50;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_48;
  size_t local_40;
  char *local_38;
  
  local_50 = protected_chars;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(chars,str->_M_string_length);
  if (code_points_main != (vector<int,_std::allocator<int>_> *)0x0) {
    std::vector<int,_std::allocator<int>_>::reserve(code_points_main,str->_M_string_length);
  }
  if (code_points_combining !=
      (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
       *)0x0) {
    std::
    vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
    ::reserve(code_points_combining,str->_M_string_length);
  }
  str_00 = (str->_M_dataplus)._M_p;
  local_48 = code_points_combining;
  do {
    if (*str_00 == '\0') {
      return;
    }
    local_58 = 0;
    u = utf8_to_cp(str_00,&local_58);
    sVar4 = 1;
    if (u != 0) {
      local_40 = local_58;
      local_5c = u;
      local_38 = str_00;
      if (((chars->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start ==
           (chars->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish) ||
         (bVar2 = is_mark(u), pvVar1 = local_50, !bVar2)) {
        if (code_points_main != (vector<int,_std::allocator<int>_> *)0x0) goto LAB_001fb603;
      }
      else {
        if ((local_50 == (vector<int,_std::allocator<int>_> *)0x0) ||
           (_Var3 = std::
                    __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                              ((local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start,
                               (local_50->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish,
                               (code_points_main->super__Vector_base<int,_std::allocator<int>_>).
                               _M_impl.super__Vector_impl_data._M_finish + -1),
           code_points_combining = local_48,
           _Var3._M_current ==
           (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish)) {
          if (code_points_combining !=
              (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *)0x0) {
            std::vector<int,_std::allocator<int>_>::push_back
                      ((code_points_combining->
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish + -1,&local_5c);
          }
          std::__cxx11::string::append
                    ((char *)((chars->
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish + -1),(ulong)str_00);
          sVar4 = local_58;
          goto LAB_001fb634;
        }
LAB_001fb603:
        std::vector<int,std::allocator<int>>::emplace_back<int&>
                  ((vector<int,std::allocator<int>> *)code_points_main,&local_5c);
      }
      if (code_points_combining !=
          (vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           *)0x0) {
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::emplace_back<>(code_points_combining);
      }
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&,unsigned_long&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)chars,
                 &local_38,&local_40);
      sVar4 = local_58;
    }
LAB_001fb634:
    str_00 = str_00 + sVar4;
  } while( true );
}

Assistant:

void explode_utf8_with_marks(const std::string& str,
                                 std::vector<std::string>& chars,
                                 std::vector<code_point_t>* code_points_main,
                                 std::vector<std::vector<code_point_t>>* code_points_combining,
                                 const std::vector<code_point_t>* protected_chars)
    {
      chars.reserve(str.length());
      if (code_points_main)
        code_points_main->reserve(str.length());
      if (code_points_combining)
        code_points_combining->reserve(str.length());

      const auto callback = [&](const char* data,
                                size_t length,
                                code_point_t code_point) {
        if (chars.empty()
            || !is_mark(code_point)
            || (protected_chars
                && std::find(protected_chars->begin(),
                             protected_chars->end(),
                             code_points_main->back()) != protected_chars->end()))
        {
          if (code_points_main)
            code_points_main->emplace_back(code_point);
          if (code_points_combining)
            code_points_combining->emplace_back();
          chars.emplace_back(data, length);
        }
        else
        {
          if (code_points_combining)
            code_points_combining->back().push_back(code_point);
          chars.back().append(data, length);
        }
      };

      character_iterator(str, callback);
    }